

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseExternalSubset(xmlParserCtxtPtr ctxt,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  unsigned_long uVar5;
  xmlCharEncoding enc;
  xmlType xVar6;
  undefined8 in_RAX;
  xmlDocPtr doc;
  byte bVar7;
  xmlChar *check;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xmlDetectSAX2(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((ctxt->encoding == (xmlChar *)0x0) &&
     (pxVar2 = ctxt->input->cur, 3 < (long)ctxt->input->end - (long)pxVar2)) {
    uStack_28 = CONCAT44(*(undefined4 *)pxVar2,(undefined4)uStack_28);
    enc = xmlDetectCharEncoding((uchar *)((long)&uStack_28 + 4),4);
    if (enc != XML_CHAR_ENCODING_NONE) {
      xmlSwitchEncoding(ctxt,enc);
    }
  }
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar2 = ctxt->input->cur;
    if (((*pxVar2 != '?') || (pxVar2[1] != 'x')) || (pxVar2[2] != 'm')) goto LAB_00160bed;
    xVar1 = pxVar2[3];
  }
  else {
    if (((ctxt->mlType != XML_TYPE_XML) || (pxVar2 = ctxt->input->cur, *pxVar2 != '<')) ||
       ((pxVar2[1] != '?' || ((pxVar2[2] != 'x' || (pxVar2[3] != 'm')))))) goto LAB_00160bed;
    xVar1 = pxVar2[4];
  }
  if ((xVar1 == 'l') && (xmlParseTextDecl(ctxt), ctxt->errNo == 0x20)) {
    xmlHaltParser(ctxt);
    return;
  }
LAB_00160bed:
  doc = ctxt->myDoc;
  if (doc == (xmlDocPtr)0x0) {
    doc = xmlNewDoc("1.0");
    ctxt->myDoc = doc;
    if (doc == (xmlDocPtr)0x0) {
      xmlErrMemory(ctxt,"New Doc failed");
      return;
    }
    doc->properties = 0x40;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    xmlCreateIntSubset(doc,(xmlChar *)0x0,ExternalID,SystemID);
  }
  ctxt->instate = XML_PARSER_DTD;
  ctxt->external = 1;
  xmlSkipBlankChars(ctxt);
  do {
    xVar6 = ctxt->mlType;
    pxVar3 = ctxt->input;
    pbVar4 = pxVar3->cur;
    bVar7 = *pbVar4;
    if (xVar6 == XML_TYPE_SML) {
      if ((0x3f < bVar7) || ((0x8000002200000000U >> ((ulong)(uint)bVar7 & 0x3f) & 1) == 0))
      goto LAB_00160d60;
    }
    else if (xVar6 == XML_TYPE_XML) {
      if (bVar7 != 0x25) {
        if (bVar7 != 0x3c) goto LAB_00160d60;
        if ((pbVar4[1] != 0x3f) && (pbVar4[1] != 0x21)) goto LAB_00160d64;
      }
    }
    else if (bVar7 != 0x25) goto LAB_00160d60;
    uVar5 = pxVar3->consumed;
    if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pbVar4 < 0xfa)) {
      xmlGROW(ctxt);
      xVar6 = ctxt->mlType;
    }
    if (xVar6 == XML_TYPE_SML) {
      pxVar2 = ctxt->input->cur;
      if ((*pxVar2 == '!') && (pxVar2[1] == '[')) goto LAB_00160d17;
LAB_00160d21:
      xmlParseMarkupDecl(ctxt);
    }
    else {
      if ((xVar6 != XML_TYPE_XML) ||
         (((pxVar2 = ctxt->input->cur, *pxVar2 != '<' || (pxVar2[1] != '!')) || (pxVar2[2] != '[')))
         ) goto LAB_00160d21;
LAB_00160d17:
      xmlParseConditionalSections(ctxt);
    }
    xmlSkipBlankChars(ctxt);
  } while ((ctxt->input->cur != pbVar4) || ((ulong)(uint)uVar5 != ctxt->input->consumed));
  xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
  bVar7 = *ctxt->input->cur;
LAB_00160d60:
  if (bVar7 != 0) {
LAB_00160d64:
    xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
  }
  return;
}

Assistant:

void
xmlParseExternalSubset(xmlParserCtxtPtr ctxt, const xmlChar *ExternalID,
                       const xmlChar *SystemID) {
    xmlDetectSAX2(ctxt);
    GROW;

    if ((ctxt->encoding == NULL) &&
        (ctxt->input->end - ctxt->input->cur >= 4)) {
        xmlChar start[4];
	xmlCharEncoding enc;

	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE)
	    xmlSwitchEncoding(ctxt, enc);
    }

    if (CMP5_MLI(CUR_PTR, '<', '?', 'x', 'm', 'l')) {
	xmlParseTextDecl(ctxt);
	if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    xmlHaltParser(ctxt);
	    return;
	}
    }
    if (ctxt->myDoc == NULL) {
        ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
	if (ctxt->myDoc == NULL) {
	    xmlErrMemory(ctxt, "New Doc failed");
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_INTERNAL;
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->intSubset == NULL))
        xmlCreateIntSubset(ctxt->myDoc, NULL, ExternalID, SystemID);

    ctxt->instate = XML_PARSER_DTD;
    ctxt->external = 1;
    SKIP_BLANKS;
    while ((CMP2_MLI(CUR_PTR, '<', '?')) ||
           (CMP2_MLI(CUR_PTR, '<', '!')) ||
	   (RAW == '%')) {
	const xmlChar *check = CUR_PTR;
	unsigned int cons = ctxt->input->consumed;

	GROW;
        if (CMP3_MLI(CUR_PTR, '<', '!', '[')) {
	    xmlParseConditionalSections(ctxt);
	} else
	    xmlParseMarkupDecl(ctxt);
        SKIP_BLANKS;

	if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
	    xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
	    break;
	}
    }

    if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
    }

}